

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall dmlc::JSONReader::ReadString(JSONReader *this,string *out_str)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  int ch;
  string *local_358;
  LogCheckError _check_err;
  LogMessageFatal local_330;
  ostringstream output;
  
  local_358 = out_str;
  ch = NextNonSpace(this);
  local_330.log_stream_ = (ostringstream)0x22;
  LogCheck_EQ<int,char>((dmlc *)&_check_err,&ch,(char *)&local_330);
  if (_check_err.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_330,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2ab);
    poVar3 = std::operator<<((ostream *)&local_330,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"ch == \'\\\"\'");
    poVar3 = std::operator<<(poVar3,(string *)_check_err.str);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"Error at");
    line_info_abi_cxx11_((string *)&output,this);
    poVar3 = std::operator<<(poVar3,(string *)&output);
    poVar3 = std::operator<<(poVar3,", Expect \'\"\' but get \'");
    poVar3 = std::operator<<(poVar3,(char)ch);
    std::operator<<(poVar3,'\'');
    std::__cxx11::string::~string((string *)&output);
    LogMessageFatal::~LogMessageFatal(&local_330);
  }
  LogCheckError::~LogCheckError(&_check_err);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&output);
  do {
    ch = NextChar(this);
    if (ch == 0x5c) {
      iVar2 = NextChar(this);
      cVar1 = (char)iVar2;
      if (cVar1 == '\"') {
        pcVar4 = "\"";
      }
      else if (cVar1 == '\\') {
        pcVar4 = "\\";
      }
      else if (cVar1 == 'n') {
        pcVar4 = "\n";
      }
      else {
        pcVar4 = "\r";
        if (cVar1 != 'r') {
          if (cVar1 != 't') {
            LogMessageFatal::LogMessageFatal
                      (&local_330,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                       ,0x2c8);
            poVar3 = std::operator<<((ostream *)&local_330,"unknown string escape \\");
            std::operator<<(poVar3,cVar1);
            LogMessageFatal::~LogMessageFatal(&local_330);
            goto LAB_00112097;
          }
          pcVar4 = "\t";
        }
      }
      std::operator<<((ostream *)&output,pcVar4);
    }
    else {
      if (ch == 0x22) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)local_358,(string *)&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&output);
        return;
      }
      std::operator<<((ostream *)&output,(char)ch);
    }
LAB_00112097:
    if ((ch + 1U < 0xf) && ((0x4801U >> (ch + 1U & 0x1f) & 1) != 0)) {
      LogMessageFatal::LogMessageFatal
                (&local_330,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x2d0);
      poVar3 = std::operator<<((ostream *)&local_330,"Error at");
      line_info_abi_cxx11_((string *)&_check_err,this);
      poVar3 = std::operator<<(poVar3,(string *)&_check_err);
      std::operator<<(poVar3,", Expect \'\"\' but reach end of line ");
      std::__cxx11::string::~string((string *)&_check_err);
      LogMessageFatal::~LogMessageFatal(&local_330);
    }
  } while( true );
}

Assistant:

inline void JSONReader::ReadString(std::string *out_str) {
  int ch = NextNonSpace();
  CHECK_EQ(ch, '\"')
      << "Error at" << line_info()
      << ", Expect \'\"\' but get \'" << static_cast<char>(ch) << '\'';
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  std::ostringstream output;
#else
  std::string output = "";
#endif
  while (true) {
    ch = NextChar();
    if (ch == '\\') {
      char sch = static_cast<char>(NextChar());
      switch (sch) {
      case 'r':
        Extend(&output, "\r");
        break;
      case 'n':
        Extend(&output, "\n");
        break;
      case '\\':
        Extend(&output, "\\");
        break;
      case 't':
        Extend(&output, "\t");
        break;
      case '\"':
        Extend(&output, "\"");
        break;
      default:
        LOG(FATAL) << "unknown string escape \\" << sch;
      }
    } else {
      if (ch == '\"')
        break;
      Extend(&output, static_cast<char>(ch));
    }
    if (ch == EOF || ch == '\r' || ch == '\n') {
      LOG(FATAL)
          << "Error at" << line_info()
          << ", Expect \'\"\' but reach end of line ";
    }
  }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *out_str = output.str();
#else
  *out_str = output;
#endif
}